

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_open.c
# Opt level: O1

zip_t * zip_open(char *fn,int _flags,int *zep)

{
  zip_source_t *src;
  zip_t *pzVar1;
  zip_error error;
  zip_error_t local_30;
  
  zip_error_init(&local_30);
  src = zip_source_file_create(fn,0,-1,&local_30);
  if (src != (zip_source_t *)0x0) {
    pzVar1 = zip_open_from_source(src,_flags,&local_30);
    if (pzVar1 != (zip_t *)0x0) goto LAB_0010c6b8;
    zip_source_free(src);
  }
  pzVar1 = (zip_t *)0x0;
  _zip_set_open_error(zep,&local_30,0);
LAB_0010c6b8:
  zip_error_fini(&local_30);
  return pzVar1;
}

Assistant:

ZIP_EXTERN zip_t *
zip_open(const char *fn, int _flags, int *zep) {
    zip_t *za;
    zip_source_t *src;
    struct zip_error error;

    zip_error_init(&error);
    if ((src = zip_source_file_create(fn, 0, -1, &error)) == NULL) {
        _zip_set_open_error(zep, &error, 0);
        zip_error_fini(&error);
        return NULL;
    }

    if ((za = zip_open_from_source(src, _flags, &error)) == NULL) {
        zip_source_free(src);
        _zip_set_open_error(zep, &error, 0);
        zip_error_fini(&error);
        return NULL;
    }

    zip_error_fini(&error);
    return za;
}